

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

Option * __thiscall CLI::App::set_help_flag(App *this,string *flag_name,string *help_description)

{
  Option *pOVar1;
  string local_40;
  
  if (this->help_ptr_ != (Option *)0x0) {
    remove_option(this,this->help_ptr_);
    this->help_ptr_ = (Option *)0x0;
  }
  if (flag_name->_M_string_length == 0) {
    pOVar1 = (Option *)0x0;
  }
  else {
    ::std::__cxx11::string::string((string *)&local_40,(string *)flag_name);
    pOVar1 = add_flag<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                       (this,&local_40,help_description);
    this->help_ptr_ = pOVar1;
    ::std::__cxx11::string::~string((string *)&local_40);
    pOVar1 = this->help_ptr_;
    (pOVar1->super_OptionBase<CLI::Option>).configurable_ = false;
  }
  return pOVar1;
}

Assistant:

Option *set_help_flag(std::string flag_name = "", const std::string &help_description = "") {
        // take flag_description by const reference otherwise add_flag tries to assign to help_description
        if(help_ptr_ != nullptr) {
            remove_option(help_ptr_);
            help_ptr_ = nullptr;
        }

        // Empty name will simply remove the help flag
        if(!flag_name.empty()) {
            help_ptr_ = add_flag(flag_name, help_description);
            help_ptr_->configurable(false);
        }

        return help_ptr_;
    }